

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLRSA.cpp
# Opt level: O0

void __thiscall OSSLRSA::encrypt(OSSLRSA *this,char *__block,int __edflag)

{
  int iVar1;
  ulong uVar2;
  RSA *rsa_00;
  size_t sVar3;
  uchar *from;
  uchar *to;
  ByteString *in_RCX;
  uint in_R8D;
  int osslPadding;
  RSA *rsa;
  ByteString *in_stack_ffffffffffffff88;
  OSSLRSAPublicKey *in_stack_ffffffffffffff90;
  int local_3c;
  
  uVar2 = (**(code **)(*(long *)__block + 0x18))(__block,OSSLRSAPublicKey::type);
  if ((uVar2 & 1) == 0) {
    softHSMLog(3,"encrypt",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
               ,0x4be,"Invalid key type supplied");
    return;
  }
  rsa_00 = (RSA *)OSSLRSAPublicKey::getOSSLKey(in_stack_ffffffffffffff90);
  if (in_R8D == 3) {
    sVar3 = ByteString::size((ByteString *)0x1394ee);
    iVar1 = RSA_size(rsa_00);
    if ((ulong)(long)(iVar1 + -0xb) < sVar3) {
      softHSMLog(3,"encrypt",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                 ,0x4cf,"Too much data supplied for RSA PKCS #1 encryption");
      return;
    }
    local_3c = 1;
  }
  else if (in_R8D == 4) {
    sVar3 = ByteString::size((ByteString *)0x13955d);
    iVar1 = RSA_size(rsa_00);
    if ((ulong)(long)(iVar1 + -0x29) < sVar3) {
      softHSMLog(3,"encrypt",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                 ,0x4dc,"Too much data supplied for RSA OAEP encryption");
      return;
    }
    local_3c = 4;
  }
  else {
    if (in_R8D != 1) {
      softHSMLog(3,"encrypt",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                 ,0x4f1,"Invalid padding mechanism supplied (%i)",(ulong)in_R8D);
      return;
    }
    sVar3 = ByteString::size((ByteString *)0x1395cc);
    iVar1 = RSA_size(rsa_00);
    if (sVar3 != (long)iVar1) {
      softHSMLog(3,"encrypt",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                 ,0x4e8,"Incorrect amount of input data supplied for raw RSA encryption");
      return;
    }
    local_3c = 3;
  }
  RSA_size(rsa_00);
  ByteString::resize(in_RCX,(size_t)in_stack_ffffffffffffff88);
  sVar3 = ByteString::size((ByteString *)0x139688);
  from = ByteString::const_byte_str(in_stack_ffffffffffffff88);
  to = ByteString::operator[](in_RCX,(size_t)in_stack_ffffffffffffff88);
  iVar1 = RSA_public_encrypt((int)sVar3,from,to,rsa_00,local_3c);
  if (iVar1 == -1) {
    uVar2 = ERR_get_error();
    softHSMLog(3,"encrypt",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
               ,0x4fb,"RSA public key encryption failed (0x%08X)",uVar2);
  }
  return;
}

Assistant:

bool OSSLRSA::encrypt(PublicKey* publicKey, const ByteString& data,
		      ByteString& encryptedData, const AsymMech::Type padding)
{
	// Check if the public key is the right type
	if (!publicKey->isOfType(OSSLRSAPublicKey::type))
	{
		ERROR_MSG("Invalid key type supplied");

		return false;
	}

	// Retrieve the OpenSSL key object
	RSA* rsa = ((OSSLRSAPublicKey*) publicKey)->getOSSLKey();

	// Check the data and padding algorithm
	int osslPadding = 0;

	if (padding == AsymMech::RSA_PKCS)
	{
		// The size of the input data cannot be more than the modulus
		// length of the key - 11
		if (data.size() > (size_t) (RSA_size(rsa) - 11))
		{
			ERROR_MSG("Too much data supplied for RSA PKCS #1 encryption");

			return false;
		}

		osslPadding = RSA_PKCS1_PADDING;
	}
	else if (padding == AsymMech::RSA_PKCS_OAEP)
	{
		// The size of the input data cannot be more than the modulus
		// length of the key - 41
		if (data.size() > (size_t) (RSA_size(rsa) - 41))
		{
			ERROR_MSG("Too much data supplied for RSA OAEP encryption");

			return false;
		}

		osslPadding = RSA_PKCS1_OAEP_PADDING;
	}
	else if (padding == AsymMech::RSA)
	{
		// The size of the input data should be exactly equal to the modulus length
		if (data.size() != (size_t) RSA_size(rsa))
		{
			ERROR_MSG("Incorrect amount of input data supplied for raw RSA encryption");

			return false;
		}

		osslPadding = RSA_NO_PADDING;
	}
	else
	{
		ERROR_MSG("Invalid padding mechanism supplied (%i)", padding);

		return false;
	}

	// Perform the RSA operation
	encryptedData.resize(RSA_size(rsa));

	if (RSA_public_encrypt(data.size(), (unsigned char*) data.const_byte_str(), &encryptedData[0], rsa, osslPadding) == -1)
	{
		ERROR_MSG("RSA public key encryption failed (0x%08X)", ERR_get_error());

		return false;
	}

	return true;
}